

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O2

int __thiscall
NNTreeImpl::compareKeyItem(NNTreeImpl *this,QPDFObjectHandle *key,QPDFObjectHandle *items,int idx)

{
  NNTreeDetails *pNVar1;
  QPDF *qpdf;
  bool bVar2;
  char cVar3;
  int iVar4;
  undefined8 extraout_RAX;
  QPDFObjectHandle QVar5;
  QPDFObjectHandle local_c0;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_b0;
  QPDFObjectHandle local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  bVar2 = QPDFObjectHandle::isArray(items);
  if ((bVar2) && (iVar4 = QPDFObjectHandle::getArrayNItems(items), idx * 2 < iVar4)) {
    pNVar1 = this->details;
    QVar5 = QPDFObjectHandle::getArrayItem(&local_a0,(int)items);
    cVar3 = (**(code **)(*(long *)pNVar1 + 8))
                      (pNVar1,&local_a0,
                       QVar5.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_a0.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (cVar3 != '\0') {
      pNVar1 = this->details;
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_b0,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)key);
      QPDFObjectHandle::getArrayItem(&local_c0,(int)items);
      iVar4 = (**(code **)(*(long *)pNVar1 + 0x10))(pNVar1,&local_b0,&local_c0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_c0.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
      return iVar4;
    }
  }
  qpdf = this->qpdf;
  std::__cxx11::to_string(&local_50,idx * 2);
  std::operator+(&local_90,"item at index ",&local_50);
  std::operator+(&local_70,&local_90," is not the right type");
  ::error(qpdf,&this->oh,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int
NNTreeImpl::compareKeyItem(QPDFObjectHandle& key, QPDFObjectHandle& items, int idx)
{
    if (!((items.isArray() && (items.getArrayNItems() > (2 * idx)) &&
           details.keyValid(items.getArrayItem(2 * idx))))) {
        QTC::TC("qpdf", "NNTree item is wrong type");
        error(
            qpdf,
            this->oh,
            ("item at index " + std::to_string(2 * idx) + " is not the right type"));
    }
    return details.compareKeys(key, items.getArrayItem(2 * idx));
}